

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_pthreads.c
# Opt level: O1

LOCK_RESULT Lock_Deinit(LOCK_HANDLE handle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (handle == (LOCK_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return LOCK_ERROR;
    }
    pcVar3 = "Invalid argument; handle is NULL.";
    iVar1 = 0x5d;
  }
  else {
    iVar1 = pthread_mutex_destroy((pthread_mutex_t *)handle);
    if (iVar1 == 0) {
      free(handle);
      return LOCK_OK;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return LOCK_ERROR;
    }
    pcVar3 = "pthread_mutex_destroy failed;";
    iVar1 = 0x6b;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/lock_pthreads.c"
            ,"Lock_Deinit",iVar1,1,pcVar3);
  return LOCK_ERROR;
}

Assistant:

LOCK_RESULT Lock_Deinit(LOCK_HANDLE handle)
{
    LOCK_RESULT result;
    if (NULL == handle)
    {
        /* Codes_SRS_LOCK_10_007: [Lock_Deinit on NULL handle passed returns LOCK_ERROR] */
        LogError("Invalid argument; handle is NULL.");
        result = LOCK_ERROR;
    }
    else
    {
        /* Codes_SRS_LOCK_10_012: [Lock_Deinit frees the memory pointed by handle] */
        if(pthread_mutex_destroy((pthread_mutex_t*)handle) == 0)
        {
            free(handle);
            handle = NULL;
            result = LOCK_OK;
        }
        else
        {
            LogError("pthread_mutex_destroy failed;");
            result = LOCK_ERROR;
        }
    }

    return result;
}